

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.cpp
# Opt level: O2

unique_ptr<TRM::Device,_std::default_delete<TRM::Device>_>
TRM::Device::CreateBitmapDevice(shared_ptr<TRM::Bitmap> *bitmap)

{
  element_type *in_RAX;
  element_type *local_18;
  
  local_18 = in_RAX;
  std::make_unique<TRM::BitmapDevice,std::shared_ptr<TRM::Bitmap>&>
            ((shared_ptr<TRM::Bitmap> *)&local_18);
  (bitmap->super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = local_18;
  return (__uniq_ptr_data<TRM::Device,_std::default_delete<TRM::Device>,_true,_true>)
         (__uniq_ptr_data<TRM::Device,_std::default_delete<TRM::Device>,_true,_true>)bitmap;
}

Assistant:

std::unique_ptr<Device> Device::CreateBitmapDevice(
    std::shared_ptr<Bitmap> bitmap) {
  return std::make_unique<BitmapDevice>(bitmap);
}